

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSession::Create
          (RTPSession *this,RTPSessionParams *sessparams,RTPTransmissionParams *transparams,
          TransmissionProtocol protocol)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  RTPUDPv6Transmitter *this_00;
  RTPMemoryManager *mgr;
  RTPTransmitter *obj;
  
  if (this->created != false) {
    return -0x3a;
  }
  bVar1 = sessparams->usepollthread;
  this->usingpollthread = bVar1;
  bVar2 = sessparams->m_needThreadSafety;
  this->needthreadsafety = bVar2;
  if ((byte)(bVar1 ^ 1U | bVar2) != 1) {
    return -0xb1;
  }
  this->useSR_BYEifpossible = sessparams->SR_BYE;
  this->sentpackets = false;
  uVar3 = sessparams->maxpacksize;
  this->maxpacksize = uVar3;
  if (uVar3 < 600) {
    return -0x3d;
  }
  this->rtptrans = (RTPTransmitter *)0x0;
  switch(protocol) {
  case IPv4UDPProto:
    this_00 = (RTPUDPv6Transmitter *)operator_new(0x30ce0,(this->super_RTPMemoryObject).mgr,0x1d);
    RTPUDPv4Transmitter::RTPUDPv4Transmitter
              ((RTPUDPv4Transmitter *)this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case IPv6UDPProto:
    this_00 = (RTPUDPv6Transmitter *)operator_new(0x30ce8,(this->super_RTPMemoryObject).mgr,0x1d);
    RTPUDPv6Transmitter::RTPUDPv6Transmitter(this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case TCPProto:
    this_00 = (RTPUDPv6Transmitter *)operator_new(200,(this->super_RTPMemoryObject).mgr,0x1d);
    RTPTCPTransmitter::RTPTCPTransmitter
              ((RTPTCPTransmitter *)this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case ExternalProto:
    this_00 = (RTPUDPv6Transmitter *)operator_new(0x70,(this->super_RTPMemoryObject).mgr,0x1d);
    RTPExternalTransmitter::RTPExternalTransmitter
              ((RTPExternalTransmitter *)this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case UserDefinedProto:
    iVar4 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])(this);
    this_00 = (RTPUDPv6Transmitter *)CONCAT44(extraout_var,iVar4);
    this->rtptrans = (RTPTransmitter *)this_00;
    if (this_00 == (RTPUDPv6Transmitter *)0x0) {
      return -0x77;
    }
    goto LAB_001223ae;
  default:
    return -0x3f;
  }
  this->rtptrans = &this_00->super_RTPTransmitter;
LAB_001223ae:
  iVar4 = (*(this_00->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[2])
                    (this_00,(ulong)this->needthreadsafety);
  obj = this->rtptrans;
  if (iVar4 < 0) {
    mgr = (this->super_RTPMemoryObject).mgr;
  }
  else {
    iVar4 = (*(obj->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
                      (obj,this->maxpacksize,transparams);
    if (-1 < iVar4) {
      this->deletetransmitter = true;
      iVar4 = InternalCreate(this,sessparams);
      return iVar4;
    }
    mgr = (this->super_RTPMemoryObject).mgr;
    obj = this->rtptrans;
  }
  RTPDelete<jrtplib::RTPTransmitter>(obj,mgr);
  return iVar4;
}

Assistant:

int RTPSession::Create(const RTPSessionParams &sessparams,const RTPTransmissionParams *transparams /* = 0 */,
		       RTPTransmitter::TransmissionProtocol protocol)
{
	int status;
	
	if (created)
		return ERR_RTP_SESSION_ALREADYCREATED;

	usingpollthread = sessparams.IsUsingPollThread();
	needthreadsafety = sessparams.NeedThreadSafety();
	if (usingpollthread && !needthreadsafety)
		return ERR_RTP_SESSION_THREADSAFETYCONFLICT;

	useSR_BYEifpossible = sessparams.GetSenderReportForBYE();
	sentpackets = false;
	
	// Check max packet size
	
	if ((maxpacksize = sessparams.GetMaximumPacketSize()) < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
		
	// Initialize the transmission component
	
	rtptrans = 0;
	switch(protocol)
	{
	case RTPTransmitter::IPv4UDPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPUDPv4Transmitter(GetMemoryManager());
		break;
#ifdef RTP_SUPPORT_IPV6
	case RTPTransmitter::IPv6UDPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPUDPv6Transmitter(GetMemoryManager());
		break;
#endif // RTP_SUPPORT_IPV6
	case RTPTransmitter::ExternalProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPExternalTransmitter(GetMemoryManager());
		break;
	case RTPTransmitter::UserDefinedProto:
		rtptrans = NewUserDefinedTransmitter();
		if (rtptrans == 0)
			return ERR_RTP_SESSION_USERDEFINEDTRANSMITTERNULL;
		break;
	case RTPTransmitter::TCPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPTCPTransmitter(GetMemoryManager());
		break;
	default:
		return ERR_RTP_SESSION_UNSUPPORTEDTRANSMISSIONPROTOCOL;
	}
	
	if (rtptrans == 0)
		return ERR_RTP_OUTOFMEM;
	if ((status = rtptrans->Init(needthreadsafety)) < 0)
	{
		RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}
	if ((status = rtptrans->Create(maxpacksize,transparams)) < 0)
	{
		RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	deletetransmitter = true;
	return InternalCreate(sessparams);
}